

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O0

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  char *pcVar1;
  char cVar2;
  _json_value *p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  long lVar14;
  long lVar15;
  uchar uVar16;
  byte bVar17;
  uchar uVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  ushort **ppuVar22;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *extraout_RDX_12;
  void *extraout_RDX_13;
  void *extraout_RDX_14;
  void *extraout_RDX_15;
  void *extraout_RDX_16;
  void *extraout_RDX_17;
  void *extraout_RDX_18;
  void *extraout_RDX_19;
  void *pvVar23;
  void *extraout_RDX_20;
  void *extraout_RDX_21;
  void *extraout_RDX_22;
  bool bVar24;
  double dVar25;
  long local_1c8;
  json_value *parent;
  char local_16d;
  json_uchar uchar2;
  char b;
  _json_value *p_Stack_168;
  uint string_length;
  char *string;
  uchar uc_b4;
  uchar uc_b3;
  uchar uc_b2;
  uchar uc_b1;
  json_uchar uchar;
  int64_t num_fraction;
  long num_e;
  long num_digits;
  long flags;
  json_state state;
  json_value *alloc;
  json_value *root;
  json_value *top;
  char *end;
  char error [128];
  char *error_buf_local;
  size_t length_local;
  char *json_local;
  json_settings *settings_local;
  
  alloc = (json_value *)0x0;
  state.cur_line = 0;
  state.cur_col = 0;
  memset(&flags,0,0x60);
  num_e = 0;
  num_fraction = 0;
  _uc_b4 = 0;
  error_buf_local = (char *)length;
  length_local = (size_t)json;
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    length_local = (size_t)(json + 3);
    error_buf_local = (char *)(length - 3);
  }
  end._0_1_ = '\0';
  top = (json_value *)(error_buf_local + length_local);
  memcpy(&state.ulong_max,settings,0x30);
  if (state.settings._8_8_ == 0) {
    state.settings._8_8_ = default_alloc;
  }
  if (state.settings.memory_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    state.settings.memory_alloc = default_free;
  }
  memset(&state,0xff,4);
  memset(&state.uint_max,0xff,8);
  state.used_memory._0_4_ = (uint)state.used_memory - 8;
  state._8_8_ = state._8_8_ + -8;
  state.settings.value_extra._0_4_ = 1;
LAB_0015424e:
  if ((int)state.settings.value_extra < 0) {
    return alloc;
  }
  p_Stack_168 = (_json_value *)0x0;
  uchar2 = 0;
  alloc = (json_value *)0x0;
  root = (json_value *)0x0;
  num_digits = 8;
  bVar13 = false;
  bVar12 = false;
  bVar11 = false;
  bVar10 = false;
  bVar9 = false;
  bVar8 = false;
  bVar7 = false;
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar24 = false;
  state.ptr._0_4_ = 1;
  state._72_8_ = length_local;
  do {
    lVar14 = num_digits;
    if ((json_value *)state._72_8_ == top) {
      local_16d = '\0';
    }
    else {
      local_16d = *(char *)state._72_8_;
    }
    if (bVar4) {
      if (local_16d == '\0') {
        snprintf((char *)&end,0x80,"Unexpected EOF in string (at %d:%d)",(ulong)(uint)state.ptr,
                 (ulong)state.ptr._4_4_);
        pvVar23 = extraout_RDX;
        goto LAB_00155ebd;
      }
      if (uchar2 <= (uint)state.used_memory) {
        if (bVar5) {
          bVar5 = false;
          switch(local_16d) {
          case 'b':
            if ((int)state.settings.value_extra == 0) {
              *(undefined1 *)((long)&p_Stack_168->parent + (ulong)uchar2) = 8;
            }
            uchar2 = uchar2 + 1;
            break;
          default:
            if ((int)state.settings.value_extra == 0) {
              *(char *)((long)&p_Stack_168->parent + (ulong)uchar2) = local_16d;
            }
            uchar2 = uchar2 + 1;
            break;
          case 'f':
            if ((int)state.settings.value_extra == 0) {
              *(undefined1 *)((long)&p_Stack_168->parent + (ulong)uchar2) = 0xc;
            }
            uchar2 = uchar2 + 1;
            break;
          case 'n':
            if ((int)state.settings.value_extra == 0) {
              *(undefined1 *)((long)&p_Stack_168->parent + (ulong)uchar2) = 10;
            }
            uchar2 = uchar2 + 1;
            break;
          case 'r':
            if ((int)state.settings.value_extra == 0) {
              *(undefined1 *)((long)&p_Stack_168->parent + (ulong)uchar2) = 0xd;
            }
            uchar2 = uchar2 + 1;
            break;
          case 't':
            if ((int)state.settings.value_extra == 0) {
              *(undefined1 *)((long)&p_Stack_168->parent + (ulong)uchar2) = 9;
            }
            uchar2 = uchar2 + 1;
            break;
          case 'u':
            if (3 < (long)top - state._72_8_) {
              pcVar1 = (char *)(state._72_8_ + 1);
              state._72_8_ = state._72_8_ + 1;
              uVar16 = hex_value(*pcVar1);
              if (uVar16 != 0xff) {
                pcVar1 = (char *)(state._72_8_ + 1);
                state._72_8_ = state._72_8_ + 1;
                bVar17 = hex_value(*pcVar1);
                if (bVar17 != 0xff) {
                  pcVar1 = (char *)(state._72_8_ + 1);
                  state._72_8_ = state._72_8_ + 1;
                  uVar18 = hex_value(*pcVar1);
                  if (uVar18 != 0xff) {
                    pcVar1 = (char *)(state._72_8_ + 1);
                    state._72_8_ = state._72_8_ + 1;
                    bVar19 = hex_value(*pcVar1);
                    if (bVar19 != 0xff) {
                      string._2_2_ = CONCAT11(uVar16 << 4 | bVar17,uVar18 << 4 | bVar19);
                      string._4_4_ = (uint)string._2_2_;
                      if ((string._4_4_ & 0xf800) == 0xd800) {
                        lVar14 = state._72_8_;
                        if (((5 < (long)top - state._72_8_) &&
                            (lVar14 = state._72_8_ + 1, *(char *)(state._72_8_ + 1) == '\\')) &&
                           (lVar14 = state._72_8_ + 2, *(char *)(state._72_8_ + 2) == 'u')) {
                          pcVar1 = (char *)(state._72_8_ + 3);
                          state._72_8_ = state._72_8_ + 3;
                          uVar16 = hex_value(*pcVar1);
                          lVar14 = state._72_8_;
                          if (uVar16 != 0xff) {
                            pcVar1 = (char *)(state._72_8_ + 1);
                            state._72_8_ = state._72_8_ + 1;
                            uVar16 = hex_value(*pcVar1);
                            lVar14 = state._72_8_;
                            if (uVar16 != 0xff) {
                              pcVar1 = (char *)(state._72_8_ + 1);
                              state._72_8_ = state._72_8_ + 1;
                              uVar18 = hex_value(*pcVar1);
                              lVar14 = state._72_8_;
                              if (uVar18 != 0xff) {
                                pcVar1 = (char *)(state._72_8_ + 1);
                                state._72_8_ = state._72_8_ + 1;
                                bVar17 = hex_value(*pcVar1);
                                lVar14 = state._72_8_;
                                if (bVar17 != 0xff) {
                                  string._2_2_ = CONCAT11(uVar16,uVar18 << 4 | bVar17);
                                  string._4_4_ = (string._4_4_ & 0x3ff) << 10 | 0x10000 |
                                                 string._2_2_ & 0x3ff;
                                  goto LAB_001547ac;
                                }
                              }
                            }
                          }
                        }
                        state._72_8_ = lVar14;
                        snprintf((char *)&end,0x80,"Invalid character value `%c` (at %d:%d)",
                                 (ulong)(uint)(int)local_16d,(ulong)(uint)state.ptr,
                                 (ulong)state.ptr._4_4_);
                        pvVar23 = extraout_RDX_01;
                        goto LAB_00155ebd;
                      }
LAB_001547ac:
                      bVar17 = (byte)string._4_4_;
                      if (string._4_4_ < 0x80) {
                        if ((int)state.settings.value_extra == 0) {
                          *(byte *)((long)&p_Stack_168->parent + (ulong)uchar2) = bVar17;
                        }
                        uchar2 = uchar2 + 1;
                      }
                      else if (string._4_4_ < 0x800) {
                        if ((int)state.settings.value_extra == 0) {
                          *(byte *)((long)&p_Stack_168->parent + (ulong)uchar2) =
                               (byte)(string._4_4_ >> 6) | 0xc0;
                          *(byte *)((long)&p_Stack_168->parent + (ulong)(uchar2 + 1)) =
                               bVar17 & 0x3f | 0x80;
                        }
                        uchar2 = uchar2 + 2;
                      }
                      else if (string._4_4_ < 0x10000) {
                        if ((int)state.settings.value_extra == 0) {
                          *(byte *)((long)&p_Stack_168->parent + (ulong)uchar2) =
                               (byte)(string._4_4_ >> 0xc) | 0xe0;
                          *(byte *)((long)&p_Stack_168->parent + (ulong)(uchar2 + 1)) =
                               (byte)(string._4_4_ >> 6) & 0x3f | 0x80;
                          *(byte *)((long)&p_Stack_168->parent + (ulong)(uchar2 + 2)) =
                               bVar17 & 0x3f | 0x80;
                        }
                        uchar2 = uchar2 + 3;
                      }
                      else {
                        if ((int)state.settings.value_extra == 0) {
                          *(byte *)((long)&p_Stack_168->parent + (ulong)uchar2) =
                               (byte)(string._4_4_ >> 0x12) | 0xf0;
                          *(byte *)((long)&p_Stack_168->parent + (ulong)(uchar2 + 1)) =
                               (byte)(string._4_4_ >> 0xc) & 0x3f | 0x80;
                          *(byte *)((long)&p_Stack_168->parent + (ulong)(uchar2 + 2)) =
                               (byte)(string._4_4_ >> 6) & 0x3f | 0x80;
                          *(byte *)((long)&p_Stack_168->parent + (ulong)(uchar2 + 3)) =
                               bVar17 & 0x3f | 0x80;
                        }
                        uchar2 = uchar2 + 4;
                      }
                      break;
                    }
                  }
                }
              }
            }
            snprintf((char *)&end,0x80,"Invalid character value `%c` (at %d:%d)",
                     (ulong)(uint)(int)local_16d,(ulong)(uint)state.ptr,(ulong)state.ptr._4_4_);
            pvVar23 = extraout_RDX_00;
            goto LAB_00155ebd;
          }
        }
        else if (local_16d == '\\') {
          bVar5 = true;
        }
        else if (local_16d == '\"') {
          if ((int)state.settings.value_extra == 0) {
            *(undefined1 *)((long)&p_Stack_168->parent + (ulong)uchar2) = 0;
          }
          p_Stack_168 = (_json_value *)0x0;
          if (root->type != json_object) {
            if (root->type == json_string) {
              (root->u).string.length = uchar2;
              bVar24 = true;
            }
            bVar4 = false;
            goto LAB_00154bd8;
          }
          if ((int)state.settings.value_extra == 0) {
            *(anon_union_8_2_291a86ad_for__reserved *)
             ((root->u).string.ptr + (ulong)(root->u).string.length * 0x18) = root->_reserved;
            *(json_uchar *)((root->u).string.ptr + (ulong)(root->u).string.length * 0x18 + 8) =
                 uchar2;
            (root->_reserved).next_alloc =
                 (_json_value *)
                 ((long)&((root->_reserved).next_alloc)->parent + (ulong)(uchar2 + 1));
          }
          else {
            (root->u).string.ptr = (root->u).string.ptr + (uchar2 + 1);
          }
          num_digits = num_digits | 0x48;
          bVar7 = true;
          bVar4 = false;
        }
        else {
          if ((int)state.settings.value_extra == 0) {
            *(char *)((long)&p_Stack_168->parent + (ulong)uchar2) = local_16d;
          }
          uchar2 = uchar2 + 1;
        }
        goto LAB_00155e0f;
      }
LAB_00155e96:
      snprintf((char *)&end,0x80,"%d:%d: Too long (caught overflow)",(ulong)(uint)state.ptr,
               (ulong)state.ptr._4_4_);
      pvVar23 = extraout_RDX_19;
LAB_00155ebd:
      if (error_buf != (char *)0x0) {
        if ((char)end == '\0') {
          strcpy(error_buf,"Unknown error");
          pvVar23 = extraout_RDX_21;
        }
        else {
          strcpy(error_buf,(char *)&end);
          pvVar23 = extraout_RDX_20;
        }
      }
      if ((int)state.settings.value_extra != 0) {
        state._88_8_ = alloc;
      }
      while (state._88_8_ != 0) {
        root = *(json_value **)(state._88_8_ + 0x20);
        (*state.settings.memory_alloc)(state._88_8_,(int)state.settings.memory_free,pvVar23);
        pvVar23 = extraout_RDX_22;
        state._88_8_ = root;
      }
      if ((int)state.settings.value_extra == 0) {
        json_value_free_ex((json_settings *)&state.ulong_max,alloc);
      }
      return (json_value *)0x0;
    }
LAB_00154bd8:
    if (((uint)state.settings.max_memory & 1) == 0) {
LAB_00154e48:
      if ((num_digits & 0x80U) == 0) {
        if ((num_digits & 8U) == 0) {
          if (root->type == json_object) {
            if (local_16d != '\t') {
              if (local_16d == '\n') {
                state.ptr._0_4_ = (uint)state.ptr + 1;
                state.ptr._4_4_ = 0;
              }
              else if ((local_16d != '\r') && (local_16d != ' ')) {
                if (local_16d == '\"') {
                  if (bVar6) {
                    snprintf((char *)&end,0x80,"%d:%d: Expected , before \"",(ulong)(uint)state.ptr,
                             (ulong)state.ptr._4_4_);
                    pvVar23 = extraout_RDX_11;
                    goto LAB_00155ebd;
                  }
                  bVar4 = true;
                  p_Stack_168 = (root->_reserved).next_alloc;
                  uchar2 = 0;
                }
                else if (local_16d == ',') {
                  if (!bVar6) goto LAB_001557bd;
                  num_digits = num_digits & 0xfffffffffffffffb;
                  bVar6 = false;
                }
                else {
                  if (local_16d != '}') {
LAB_001557bd:
                    snprintf((char *)&end,0x80,"%d:%d: Unexpected `%c` in object",
                             (ulong)(uint)state.ptr,(ulong)state.ptr._4_4_,
                             (ulong)(uint)(int)local_16d);
                    pvVar23 = extraout_RDX_12;
                    goto LAB_00155ebd;
                  }
                  num_digits = num_digits & 0xfffffffffffffffb;
                  bVar6 = false;
                  bVar24 = true;
                }
LAB_00155ca1:
                if (bVar13) {
                  bVar13 = false;
                  state._72_8_ = state._72_8_ + -1;
                }
                if (bVar24) {
                  if (root->parent == (_json_value *)0x0) {
                    num_digits = num_digits | 0x84;
                    bVar6 = true;
                    bVar24 = false;
                  }
                  else {
                    if (root->parent->type == json_array) {
                      num_digits = num_digits | 0xc;
                    }
                    bVar6 = true;
                    bVar24 = false;
                    if ((int)state.settings.value_extra == 0) {
                      p_Var3 = root->parent;
                      if (p_Var3->type == json_object) {
                        *(json_value **)
                         ((p_Var3->u).string.ptr + (ulong)(p_Var3->u).string.length * 0x18 + 0x10) =
                             root;
                      }
                      else if (p_Var3->type == json_array) {
                        *(json_value **)
                         ((p_Var3->u).string.ptr + (ulong)(p_Var3->u).string.length * 8) = root;
                      }
                    }
                    uVar21 = (root->parent->u).boolean + 1;
                    (root->parent->u).string.length = uVar21;
                    if ((uint)state.used_memory < uVar21) goto LAB_00155e96;
                    root = root->parent;
                  }
                }
              }
            }
          }
          else {
            if (1 < root->type - json_integer) goto LAB_00155ca1;
            ppuVar22 = __ctype_b_loc();
            if (((*ppuVar22)[(int)local_16d] & 0x800) == 0) {
              if ((local_16d == '+') || (local_16d == '-')) {
                if ((!bVar8) || (bVar10)) goto LAB_00155a61;
                if (local_16d == '-') {
                  bVar11 = true;
                }
                bVar10 = true;
              }
              else {
                if ((local_16d != '.') || (root->type != json_integer)) {
LAB_00155a61:
                  if (bVar8) {
                    if (num_e == 0) {
                      snprintf((char *)&end,0x80,"%d:%d: Expected digit after `e`",
                               (ulong)(uint)state.ptr,(ulong)state.ptr._4_4_);
                      pvVar23 = extraout_RDX_16;
                      goto LAB_00155ebd;
                    }
                    if (bVar11) {
                      local_1c8 = -num_fraction;
                    }
                    else {
                      local_1c8 = num_fraction;
                    }
                    dVar25 = pow(10.0,(double)local_1c8);
                    (root->u).dbl = dVar25 * (root->u).dbl;
                  }
                  else {
                    if (root->type == json_double) {
                      if (num_e == 0) {
                        snprintf((char *)&end,0x80,"%d:%d: Expected digit after `.`",
                                 (ulong)(uint)state.ptr,(ulong)state.ptr._4_4_);
                        pvVar23 = extraout_RDX_15;
                        goto LAB_00155ebd;
                      }
                      dVar25 = pow(10.0,(double)num_e);
                      (root->u).dbl = (double)_uc_b4 / dVar25 + (root->u).dbl;
                    }
                    if ((local_16d == 'e') || (local_16d == 'E')) {
                      if (root->type == json_integer) {
                        root->type = json_double;
                        (root->u).dbl = (double)(root->u).integer;
                      }
                      num_e = 0;
                      bVar9 = false;
                      bVar8 = true;
                      goto LAB_00155e0f;
                    }
                  }
                  if (bVar12) {
                    if (root->type == json_integer) {
                      (root->u).integer = -(root->u).integer;
                    }
                    else {
                      (root->u).integer = (root->u).integer ^ 0x8000000000000000;
                    }
                  }
                  bVar13 = true;
                  bVar24 = true;
                  goto LAB_00155ca1;
                }
                if (num_e == 0) {
                  snprintf((char *)&end,0x80,"%d:%d: Expected digit before `.`",
                           (ulong)(uint)state.ptr,(ulong)state.ptr._4_4_);
                  pvVar23 = extraout_RDX_14;
                  goto LAB_00155ebd;
                }
                root->type = json_double;
                (root->u).dbl = (double)(root->u).integer;
                num_e = 0;
              }
            }
            else {
              num_e = num_e + 1;
              if ((root->type == json_integer) || (bVar8)) {
                if (bVar8) {
                  bVar10 = true;
                  num_fraction = num_fraction * 10 + (long)(local_16d + -0x30);
                }
                else {
                  if (bVar9) {
                    snprintf((char *)&end,0x80,"%d:%d: Unexpected `0` before `%c`",
                             (ulong)(uint)state.ptr,(ulong)state.ptr._4_4_,
                             (ulong)(uint)(int)local_16d);
                    pvVar23 = extraout_RDX_13;
                    goto LAB_00155ebd;
                  }
                  if ((num_e == 1) && (local_16d == '0')) {
                    bVar9 = true;
                  }
                  (root->u).integer = (root->u).integer * 10 + (long)(local_16d + -0x30);
                }
              }
              else {
                _uc_b4 = _uc_b4 * 10 + (long)(local_16d + -0x30);
              }
            }
          }
        }
        else if (local_16d != '\t') {
          if (local_16d == '\n') {
            state.ptr._0_4_ = (uint)state.ptr + 1;
            state.ptr._4_4_ = 0;
          }
          else if ((local_16d != '\r') && (local_16d != ' ')) {
            if (local_16d == ']') {
              if ((root == (json_value *)0x0) || (root->type != json_array)) {
                snprintf((char *)&end,0x80,"%d:%d: Unexpected ]",(ulong)(uint)state.ptr,
                         (ulong)state.ptr._4_4_);
                pvVar23 = extraout_RDX_07;
                goto LAB_00155ebd;
              }
              num_digits = num_digits & 0xfffffffffffffff3;
              bVar6 = false;
              bVar24 = true;
              goto LAB_00155ca1;
            }
            if (bVar6) {
              if (local_16d != ',') {
                snprintf((char *)&end,0x80,"%d:%d: Expected , before %c",(ulong)(uint)state.ptr,
                         (ulong)state.ptr._4_4_,(ulong)(uint)(int)local_16d);
                pvVar23 = extraout_RDX_08;
                goto LAB_00155ebd;
              }
              num_digits = num_digits & 0xfffffffffffffffb;
              bVar6 = false;
            }
            else {
              if (!bVar7) {
                num_digits = num_digits & 0xfffffffffffffff7;
                if (local_16d == '\"') {
                  iVar20 = new_value((json_state *)&flags,&root,&alloc,
                                     (json_value **)&state.cur_line,json_string);
                  if (iVar20 != 0) {
                    bVar4 = true;
                    p_Stack_168 = (_json_value *)(root->u).object.values;
                    uchar2 = 0;
                    goto LAB_00155e0f;
                  }
                }
                else if (local_16d == '[') {
                  iVar20 = new_value((json_state *)&flags,&root,&alloc,
                                     (json_value **)&state.cur_line,json_array);
                  if (iVar20 != 0) {
                    num_digits = num_digits | 8;
                    goto LAB_00155e0f;
                  }
                }
                else {
                  lVar15 = state._72_8_;
                  if (local_16d == 'f') {
                    if (((((long)top - state._72_8_ < 4) ||
                         (lVar15 = state._72_8_ + 1, *(char *)(state._72_8_ + 1) != 'a')) ||
                        (lVar15 = state._72_8_ + 2, *(char *)(state._72_8_ + 2) != 'l')) ||
                       ((lVar15 = state._72_8_ + 3, *(char *)(state._72_8_ + 3) != 's' ||
                        (lVar15 = state._72_8_ + 4, *(char *)(state._72_8_ + 4) != 'e')))) {
LAB_00155e58:
                      state._72_8_ = lVar15;
                      snprintf((char *)&end,0x80,"%d:%d: Unknown value",(ulong)(uint)state.ptr,
                               (ulong)state.ptr._4_4_);
                      pvVar23 = extraout_RDX_17;
                      goto LAB_00155ebd;
                    }
                    state._72_8_ = state._72_8_ + 4;
                    iVar20 = new_value((json_state *)&flags,&root,&alloc,
                                       (json_value **)&state.cur_line,json_boolean);
                    if (iVar20 != 0) {
                      bVar24 = true;
                      goto LAB_00155ca1;
                    }
                  }
                  else if (local_16d == 'n') {
                    if ((((long)top - state._72_8_ < 3) ||
                        (lVar15 = state._72_8_ + 1, *(char *)(state._72_8_ + 1) != 'u')) ||
                       ((lVar15 = state._72_8_ + 2, *(char *)(state._72_8_ + 2) != 'l' ||
                        (lVar15 = state._72_8_ + 3, *(char *)(state._72_8_ + 3) != 'l'))))
                    goto LAB_00155e58;
                    state._72_8_ = state._72_8_ + 3;
                    iVar20 = new_value((json_state *)&flags,&root,&alloc,
                                       (json_value **)&state.cur_line,json_null);
                    if (iVar20 != 0) {
                      bVar24 = true;
                      goto LAB_00155ca1;
                    }
                  }
                  else if (local_16d == 't') {
                    if (((((long)top - state._72_8_ < 3) ||
                         (lVar15 = state._72_8_ + 1, *(char *)(state._72_8_ + 1) != 'r')) ||
                        (lVar15 = state._72_8_ + 2, *(char *)(state._72_8_ + 2) != 'u')) ||
                       (lVar15 = state._72_8_ + 3, *(char *)(state._72_8_ + 3) != 'e'))
                    goto LAB_00155e58;
                    state._72_8_ = state._72_8_ + 3;
                    iVar20 = new_value((json_state *)&flags,&root,&alloc,
                                       (json_value **)&state.cur_line,json_boolean);
                    if (iVar20 != 0) {
                      (root->u).boolean = 1;
                      bVar24 = true;
                      goto LAB_00155ca1;
                    }
                  }
                  else if (local_16d == '{') {
                    iVar20 = new_value((json_state *)&flags,&root,&alloc,
                                       (json_value **)&state.cur_line,json_object);
                    if (iVar20 != 0) goto LAB_00155e0f;
                  }
                  else {
                    ppuVar22 = __ctype_b_loc();
                    if ((((*ppuVar22)[(int)local_16d] & 0x800) == 0) && (local_16d != '-')) {
                      snprintf((char *)&end,0x80,"%d:%d: Unexpected %c when seeking value",
                               (ulong)(uint)state.ptr,(ulong)state.ptr._4_4_,
                               (ulong)(uint)(int)local_16d);
                      pvVar23 = extraout_RDX_10;
                      goto LAB_00155ebd;
                    }
                    iVar20 = new_value((json_state *)&flags,&root,&alloc,
                                       (json_value **)&state.cur_line,json_integer);
                    if (iVar20 != 0) {
                      if ((int)state.settings.value_extra == 0) {
                        while( true ) {
                          ppuVar22 = __ctype_b_loc();
                          bVar24 = true;
                          if (((((*ppuVar22)[(int)local_16d] & 0x800) == 0) &&
                              (bVar24 = true, local_16d != '+')) &&
                             ((bVar24 = true, local_16d != '-' &&
                              ((bVar24 = true, local_16d != 'e' && (bVar24 = true, local_16d != 'E')
                               ))))) {
                            bVar24 = local_16d == '.';
                          }
                          if ((!bVar24) ||
                             (state._72_8_ = state._72_8_ + 1, (json_value *)state._72_8_ == top))
                          break;
                          local_16d = *(char *)&((json_value *)state._72_8_)->parent;
                        }
                        bVar13 = true;
                        bVar24 = true;
                      }
                      else {
                        num_digits = lVar14 & 0xffffffffffffe0f7;
                        num_e = 0;
                        _uc_b4 = 0;
                        num_fraction = 0;
                        if (local_16d == '-') {
                          bVar12 = true;
                          bVar11 = false;
                          bVar10 = false;
                          bVar9 = false;
                          bVar8 = false;
                          goto LAB_00155e0f;
                        }
                        bVar13 = true;
                        bVar12 = false;
                        bVar11 = false;
                        bVar10 = false;
                        bVar9 = false;
                        bVar8 = false;
                      }
                      goto LAB_00155ca1;
                    }
                  }
                }
                strcpy((char *)&end,"Memory allocation failure");
                pvVar23 = extraout_RDX_18;
                goto LAB_00155ebd;
              }
              if (local_16d != ':') {
                snprintf((char *)&end,0x80,"%d:%d: Expected : before %c",(ulong)(uint)state.ptr,
                         (ulong)state.ptr._4_4_,(ulong)(uint)(int)local_16d);
                pvVar23 = extraout_RDX_09;
                goto LAB_00155ebd;
              }
              num_digits = num_digits & 0xffffffffffffffbf;
              bVar7 = false;
            }
          }
        }
      }
      else {
        if (local_16d == '\0') break;
        switch(local_16d) {
        case '\n':
          state.ptr._0_4_ = (uint)state.ptr + 1;
          state.ptr._4_4_ = 0;
        case '\t':
        case '\r':
        case ' ':
          break;
        default:
          snprintf((char *)&end,0x80,"%d:%d: Trailing garbage: `%c`",(ulong)(uint)state.ptr,
                   (ulong)state.ptr._4_4_,(ulong)(uint)(int)local_16d);
          pvVar23 = extraout_RDX_06;
          goto LAB_00155ebd;
        }
      }
    }
    else if ((num_digits & 0x6000U) == 0) {
      if (local_16d != '/') goto LAB_00154e48;
      if (((num_digits & 0x88U) == 0) && (root->type != json_object)) {
        snprintf((char *)&end,0x80,"%d:%d: Comment not allowed here",(ulong)(uint)state.ptr,
                 (ulong)state.ptr._4_4_);
        pvVar23 = extraout_RDX_03;
        goto LAB_00155ebd;
      }
      state._72_8_ = state._72_8_ + 1;
      if ((json_value *)state._72_8_ == top) {
        snprintf((char *)&end,0x80,"%d:%d: EOF unexpected",(ulong)(uint)state.ptr,
                 (ulong)state.ptr._4_4_);
        pvVar23 = extraout_RDX_04;
        goto LAB_00155ebd;
      }
      cVar2 = *(char *)&((json_value *)state._72_8_)->parent;
      if (cVar2 == '*') {
        num_digits = num_digits | 0x4000;
      }
      else {
        if (cVar2 != '/') {
          snprintf((char *)&end,0x80,"%d:%d: Unexpected `%c` in comment opening sequence",
                   (ulong)(uint)state.ptr,(ulong)state.ptr._4_4_,(ulong)(uint)(int)cVar2);
          pvVar23 = extraout_RDX_05;
          goto LAB_00155ebd;
        }
        num_digits = num_digits | 0x2000;
      }
    }
    else if ((num_digits & 0x2000U) == 0) {
      if ((num_digits & 0x4000U) == 0) goto LAB_00154e48;
      if (local_16d == '\0') {
        snprintf((char *)&end,0x80,"%d:%d: Unexpected EOF in block comment",(ulong)(uint)state.ptr,
                 (ulong)state.ptr._4_4_);
        pvVar23 = extraout_RDX_02;
        goto LAB_00155ebd;
      }
      if (((local_16d == '*') &&
          ((ulong)state._72_8_ < (undefined1 *)((long)&top[-1]._reserved + 7U))) &&
         (*(char *)(state._72_8_ + 1) == '/')) {
        num_digits = num_digits & 0xffffffffffffbfff;
        state._72_8_ = state._72_8_ + 1;
      }
    }
    else if (((local_16d == '\r') || (local_16d == '\n')) || (local_16d == '\0')) {
      num_digits = num_digits & 0xffffffffffffdfff;
      state._72_8_ = state._72_8_ + -1;
    }
LAB_00155e0f:
    state._72_8_ = state._72_8_ + 1;
  } while( true );
  state._88_8_ = alloc;
  state.settings.value_extra._0_4_ = (int)state.settings.value_extra + -1;
  goto LAB_0015424e;
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value *top, *root = NULL, * alloc = 0;
   json_state state = EMPTY_STATE_STRUCT;
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.memory_alloc)
      state.settings.memory_alloc = default_alloc;

   if (!state.settings.memory_free)
      state.settings.memory_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);

         if (flags & flag_string)
         {
            if (!b)
            {  snprintf (error, sizeof(error), "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr < 4 ||
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;

                        if (end - state.ptr < 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;

                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  snprintf (error, sizeof(error), "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  snprintf (error, sizeof(error), "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  snprintf (error, sizeof(error), "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:

               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;

                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;

            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   snprintf (error, sizeof(error), "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   snprintf (error, sizeof(error), "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.memory_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}